

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O3

void beltMACStepG_internal(void *state)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (*(long *)((long)state + 0x60) == 0x10) {
    uVar1 = *(ulong *)((long)state + 0x50) ^ *(ulong *)((long)state + 0x20);
    uVar3 = *(ulong *)((long)state + 0x58) ^ *(ulong *)((long)state + 0x28);
    *(uint *)((long)state + 0x40) = (uint)uVar1 ^ *(uint *)((long)state + 0x34);
    *(uint *)((long)state + 0x44) = (uint)(uVar1 >> 0x20) ^ *(uint *)((long)state + 0x38);
    *(uint *)((long)state + 0x48) = *(uint *)((long)state + 0x3c) ^ (uint)uVar3;
    uVar2 = (uint)(uVar3 >> 0x20) ^ *(uint *)((long)state + 0x30) ^ *(uint *)((long)state + 0x34);
  }
  else {
    *(undefined1 *)((long)state + *(long *)((long)state + 0x60) + 0x50) = 0x80;
    memSet((void *)((long)state + *(long *)((long)state + 0x60) + 0x51),'\0',
           0xf - *(long *)((long)state + 0x60));
    uVar1 = *(ulong *)((long)state + 0x50) ^ *(ulong *)((long)state + 0x20);
    uVar3 = *(ulong *)((long)state + 0x58) ^ *(ulong *)((long)state + 0x28);
    *(uint *)((long)state + 0x40) =
         *(uint *)((long)state + 0x3c) ^ (uint)uVar1 ^ *(uint *)((long)state + 0x30);
    *(uint *)((long)state + 0x44) = (uint)(uVar1 >> 0x20) ^ *(uint *)((long)state + 0x30);
    *(uint *)((long)state + 0x48) = *(uint *)((long)state + 0x34) ^ (uint)uVar3;
    uVar2 = (uint)(uVar3 >> 0x20) ^ *(uint *)((long)state + 0x38);
  }
  *(uint *)((long)state + 0x4c) = uVar2;
  beltBlockEncr2((u32 *)((long)state + 0x40),(u32 *)state);
  return;
}

Assistant:

static void beltMACStepG_internal(void* state)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(memIsValid(state, beltMAC_keep()));
	// полный блок?
	if (st->filled == 16)
	{
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor(st->mac, st->s, st->block);
		st->mac[0] ^= st->r[1];
		st->mac[1] ^= st->r[2];
		st->mac[2] ^= st->r[3];
		st->mac[3] ^= st->r[0] ^ st->r[1];
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
	}
	// неполный (в т.ч. пустой) блок?
	else
	{
		st->block[st->filled] = 0x80;
		memSetZero(st->block + st->filled + 1, 16 - st->filled - 1);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor(st->mac, st->s, st->block);
		st->mac[0] ^= st->r[0] ^ st->r[3];
		st->mac[1] ^= st->r[0];
		st->mac[2] ^= st->r[1];
		st->mac[3] ^= st->r[2];
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
	}
	beltBlockEncr2(st->mac, st->key);
}